

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferV.cpp
# Opt level: O0

void __thiscall
adios2::format::BufferV::BufferV
          (BufferV *this,string *type,bool AlwaysCopy,size_t MemAlign,size_t MemBlockSize)

{
  undefined8 in_RCX;
  byte in_DL;
  string *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  
  *in_RDI = &PTR__BufferV_011339e0;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  in_RDI[5] = in_RCX;
  in_RDI[6] = in_R8;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0xad91f1);
  *(byte *)(in_RDI + 10) = in_DL & 1;
  std::vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
  ::vector((vector<adios2::format::BufferV::VecEntry,_std::allocator<adios2::format::BufferV::VecEntry>_>
            *)0xad9208);
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  return;
}

Assistant:

BufferV::BufferV(const std::string type, const bool AlwaysCopy, const size_t MemAlign,
                 const size_t MemBlockSize)
: m_Type(type), m_MemAlign(MemAlign), m_MemBlockSize(MemBlockSize), m_AlwaysCopy(AlwaysCopy)
{
}